

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboDepthbufferTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Functional::FboDepthTests::init(FboDepthTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  FboTestCase *pFVar4;
  char *pcVar5;
  long lVar6;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic depth tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar6 = 0;
  do {
    pFVar4 = (FboTestCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::depthFormats + lVar6);
    pcVar5 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar4,pCVar2,pcVar5,::glcts::fixed_sample_locations_values + 1,false);
    (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_021542a8;
    *(deUint32 *)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined8 *)
     ((long)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x7f00000077;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar4);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_write_clamp","Depth write clamping tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar6 = 0;
  do {
    pFVar4 = (FboTestCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::depthFormats + lVar6);
    pcVar5 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar4,pCVar2,pcVar5,::glcts::fixed_sample_locations_values + 1,false);
    (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_02154310;
    *(deUint32 *)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined8 *)
     ((long)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x7f00000077;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar4);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_test_clamp","Depth test value clamping tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar6 = 0;
  do {
    pFVar4 = (FboTestCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)init::depthFormats + lVar6);
    pcVar5 = FboTestUtil::getFormatName(dVar1);
    FboTestCase::FboTestCase(pFVar4,pCVar2,pcVar5,::glcts::fixed_sample_locations_values + 1,false);
    (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_02154378;
    *(deUint32 *)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar1;
    *(undefined8 *)
     ((long)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x7f00000077;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar4);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  return extraout_EAX;
}

Assistant:

void FboDepthTests::init (void)
{
	static const deUint32 depthFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic depth tests");
		addChild(basicGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			basicGroup->addChild(new BasicFboDepthCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}

	// .depth_write_clamp
	{
		tcu::TestCaseGroup* depthClampGroup = new tcu::TestCaseGroup(m_testCtx, "depth_write_clamp", "Depth write clamping tests");
		addChild(depthClampGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			depthClampGroup->addChild(new DepthWriteClampCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}

	// .depth_test_clamp
	{
		tcu::TestCaseGroup* depthClampGroup = new tcu::TestCaseGroup(m_testCtx, "depth_test_clamp", "Depth test value clamping tests");
		addChild(depthClampGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			depthClampGroup->addChild(new DepthTestClampCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}
}